

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::js::api::json::CreateRawPeginRequest::CreateRawPeginRequest(CreateRawPeginRequest *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::js::api::json::CreateRawPeginRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__CreateRawPeginRequest_00a92908;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->version_ = 2;
  this->locktime_ = 0;
  (this->txins_).super_JsonVector<cfd::js::api::json::ElementsPeginTxIn>.
  super_vector<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>
  .
  super__Vector_base<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txins_).super_JsonVector<cfd::js::api::json::ElementsPeginTxIn>.
  super_vector<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>
  .
  super__Vector_base<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txins_).super_JsonVector<cfd::js::api::json::ElementsPeginTxIn>.
  super_vector<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>
  .
  super__Vector_base<cfd::js::api::json::ElementsPeginTxIn,_std::allocator<cfd::js::api::json::ElementsPeginTxIn>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txins_).super_JsonVector<cfd::js::api::json::ElementsPeginTxIn>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00a90b00;
  (this->txouts_).super_JsonVector<cfd::js::api::json::ElementsTxOut>.
  super_vector<cfd::js::api::json::ElementsTxOut,_std::allocator<cfd::js::api::json::ElementsTxOut>_>
  .
  super__Vector_base<cfd::js::api::json::ElementsTxOut,_std::allocator<cfd::js::api::json::ElementsTxOut>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txouts_).super_JsonVector<cfd::js::api::json::ElementsTxOut>.
  super_vector<cfd::js::api::json::ElementsTxOut,_std::allocator<cfd::js::api::json::ElementsTxOut>_>
  .
  super__Vector_base<cfd::js::api::json::ElementsTxOut,_std::allocator<cfd::js::api::json::ElementsTxOut>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txouts_).super_JsonVector<cfd::js::api::json::ElementsTxOut>.
  super_vector<cfd::js::api::json::ElementsTxOut,_std::allocator<cfd::js::api::json::ElementsTxOut>_>
  .
  super__Vector_base<cfd::js::api::json::ElementsTxOut,_std::allocator<cfd::js::api::json::ElementsTxOut>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txouts_).super_JsonVector<cfd::js::api::json::ElementsTxOut>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00a90858;
  ElementsTxOutFee::ElementsTxOutFee(&this->fee_);
  this->is_random_sort_tx_out_ = false;
  CollectFieldName();
  return;
}

Assistant:

CreateRawPeginRequest() {
    CollectFieldName();
  }